

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_read(mg_connection *conn,void *buf,size_t len)

{
  int iVar1;
  ushort **ppuVar2;
  bool bVar3;
  int local_9c;
  ulong uStack_98;
  int crlf_count;
  unsigned_long chunkSize;
  char *end;
  char lenbuf [64];
  ulong local_40;
  size_t i;
  char x [2];
  long lStack_30;
  int read_ret;
  size_t all_read;
  size_t len_local;
  void *buf_local;
  mg_connection *conn_local;
  
  all_read = len;
  if (0x7fffffff < len) {
    all_read = 0x7fffffff;
  }
  if (conn == (mg_connection *)0x0) {
    conn_local._4_4_ = 0;
  }
  else {
    if (conn->is_chunked != 0) {
      lStack_30 = 0;
      do {
        while( true ) {
          if (all_read == 0) goto LAB_0011ba5a;
          if (2 < conn->is_chunked) {
            return 0;
          }
          if (conn->is_chunked != 1) {
            return -1;
          }
          if (conn->consumed_content == conn->content_len) break;
          i._4_4_ = mg_read_inner(conn,(void *)((long)buf + lStack_30),all_read);
          if (i._4_4_ < 1) {
            conn->is_chunked = 2;
            return -1;
          }
          lStack_30 = i._4_4_ + lStack_30;
          all_read = all_read - (long)i._4_4_;
          if (conn->consumed_content == conn->content_len) {
            conn->content_len = conn->content_len + 2;
            iVar1 = mg_read_inner(conn,(void *)((long)&i + 2),2);
            if (((iVar1 != 2) || (i._2_1_ != '\r')) || (i._3_1_ != '\n')) {
              conn->is_chunked = 2;
              return -1;
            }
          }
        }
        chunkSize = 0;
        uStack_98 = 0;
        for (local_40 = 0; local_40 < 0x3f; local_40 = local_40 + 1) {
          conn->content_len = conn->content_len + 1;
          iVar1 = mg_read_inner(conn,lenbuf + (local_40 - 8),1);
          if (iVar1 != 1) {
            lenbuf[local_40 - 8] = '\0';
          }
          if ((local_40 != 0) && (lenbuf[local_40 - 8] == ';')) {
            do {
              conn->content_len = conn->content_len + 1;
              iVar1 = mg_read_inner(conn,lenbuf + (local_40 - 8),1);
              bVar3 = false;
              if (iVar1 == 1) {
                bVar3 = lenbuf[local_40 - 8] != '\r';
              }
            } while (bVar3);
          }
          if (((local_40 == 0) || (lenbuf[local_40 - 8] != '\r')) ||
             (*(char *)((long)&chunkSize + local_40 + 7) == '\r')) {
            if (((1 < local_40) && (lenbuf[local_40 - 8] == '\n')) &&
               (*(char *)((long)&chunkSize + local_40 + 7) == '\r')) {
              lenbuf[local_40 - 7] = '\0';
              uStack_98 = strtoul((char *)&end,(char **)&chunkSize,0x10);
              if (uStack_98 == 0) {
                conn->is_chunked = 3;
              }
              break;
            }
            ppuVar2 = __ctype_b_loc();
            if (((*ppuVar2)[(int)(uint)(byte)lenbuf[local_40 - 8]] & 0x1000) == 0) {
              conn->is_chunked = 2;
              return -1;
            }
          }
        }
        if ((chunkSize == 0) || (*(char *)chunkSize != '\r')) {
          conn->is_chunked = 2;
          return -1;
        }
        if (conn->is_chunked == 3) {
          local_9c = 2;
          while( true ) {
            bVar3 = false;
            if (local_9c < 4) {
              bVar3 = conn->is_chunked == 3;
            }
            if (!bVar3) break;
            conn->content_len = conn->content_len + 1;
            iVar1 = mg_read_inner(conn,&end,1);
            if (iVar1 == 1) {
              if ((local_9c == 0) || (local_9c == 2)) {
                if ((char)end == '\r') {
                  local_9c = local_9c + 1;
                }
                else {
                  local_9c = 0;
                }
              }
              else if ((char)end == '\n') {
                local_9c = local_9c + 1;
              }
              else {
                conn->is_chunked = 2;
              }
            }
            else {
              conn->is_chunked = 2;
            }
          }
          if (conn->is_chunked == 2) {
            return -1;
          }
          conn->is_chunked = 4;
LAB_0011ba5a:
          return (int)lStack_30;
        }
        conn->content_len = uStack_98 + conn->content_len;
      } while( true );
    }
    conn_local._4_4_ = mg_read_inner(conn,buf,all_read);
  }
  return conn_local._4_4_;
}

Assistant:

CIVETWEB_API int
mg_read(struct mg_connection *conn, void *buf, size_t len)
{
	if (len > INT_MAX) {
		len = INT_MAX;
	}

	if (conn == NULL) {
		return 0;
	}

	if (conn->is_chunked) {
		size_t all_read = 0;

		while (len > 0) {
			if (conn->is_chunked >= 3) {
				/* No more data left to read */
				return 0;
			}
			if (conn->is_chunked != 1) {
				/* Has error */
				return -1;
			}

			if (conn->consumed_content != conn->content_len) {
				/* copy from the current chunk */
				int read_ret = mg_read_inner(conn, (char *)buf + all_read, len);

				if (read_ret < 1) {
					/* read error */
					conn->is_chunked = 2;
					return -1;
				}

				all_read += (size_t)read_ret;
				len -= (size_t)read_ret;

				if (conn->consumed_content == conn->content_len) {
					/* Add data bytes in the current chunk have been read,
					 * so we are expecting \r\n now. */
					char x[2];
					conn->content_len += 2;
					if ((mg_read_inner(conn, x, 2) != 2) || (x[0] != '\r')
					    || (x[1] != '\n')) {
						/* Protocol violation */
						conn->is_chunked = 2;
						return -1;
					}
				}

			} else {
				/* fetch a new chunk */
				size_t i;
				char lenbuf[64];
				char *end = NULL;
				unsigned long chunkSize = 0;

				for (i = 0; i < (sizeof(lenbuf) - 1); i++) {
					conn->content_len++;
					if (mg_read_inner(conn, lenbuf + i, 1) != 1) {
						lenbuf[i] = 0;
					}
					if ((i > 0) && (lenbuf[i] == ';')) {
						// chunk extension --> skip chars until next CR
						//
						// RFC 2616, 3.6.1 Chunked Transfer Coding
						// (https://www.rfc-editor.org/rfc/rfc2616#page-25)
						//
						// chunk          = chunk-size [ chunk-extension ] CRLF
						//                  chunk-data CRLF
						// ...
						// chunk-extension= *( ";" chunk-ext-name [ "="
						// chunk-ext-val ] )
						do
							++conn->content_len;
						while (mg_read_inner(conn, lenbuf + i, 1) == 1
						       && lenbuf[i] != '\r');
					}
					if ((i > 0) && (lenbuf[i] == '\r')
					    && (lenbuf[i - 1] != '\r')) {
						continue;
					}
					if ((i > 1) && (lenbuf[i] == '\n')
					    && (lenbuf[i - 1] == '\r')) {
						lenbuf[i + 1] = 0;
						chunkSize = strtoul(lenbuf, &end, 16);
						if (chunkSize == 0) {
							/* regular end of content */
							conn->is_chunked = 3;
						}
						break;
					}
					if (!isxdigit((unsigned char)lenbuf[i])) {
						/* illegal character for chunk length */
						conn->is_chunked = 2;
						return -1;
					}
				}
				if ((end == NULL) || (*end != '\r')) {
					/* chunksize not set correctly */
					conn->is_chunked = 2;
					return -1;
				}
				if (conn->is_chunked == 3) {
					/* try discarding trailer for keep-alive */

					// We found the last chunk (length 0) including the
					// CRLF that terminates that chunk. Now follows a possibly
					// empty trailer and a final CRLF.
					//
					// see RFC 2616, 3.6.1 Chunked Transfer Coding
					// (https://www.rfc-editor.org/rfc/rfc2616#page-25)
					//
					// Chunked-Body   = *chunk
					// 	                last-chunk
					// 	                trailer
					// 	                CRLF
					// ...
					// last-chunk     = 1*("0") [ chunk-extension ] CRLF
					// ...
					// trailer        = *(entity-header CRLF)

					int crlf_count = 2; // one CRLF already determined

					while (crlf_count < 4 && conn->is_chunked == 3) {
						++conn->content_len;
						if (mg_read_inner(conn, lenbuf, 1) == 1) {
							if ((crlf_count == 0 || crlf_count == 2)) {
								if (lenbuf[0] == '\r')
									++crlf_count;
								else
									crlf_count = 0;
							} else {
								// previous character was a CR
								// --> next character must be LF

								if (lenbuf[0] == '\n')
									++crlf_count;
								else
									conn->is_chunked = 2;
							}
						} else
							// premature end of trailer
							conn->is_chunked = 2;
					}

					if (conn->is_chunked == 2)
						return -1;
					else
						conn->is_chunked = 4;

					break;
				}

				/* append a new chunk */
				conn->content_len += (int64_t)chunkSize;
			}
		}

		return (int)all_read;
	}
	return mg_read_inner(conn, buf, len);
}